

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::blowUpActiveAggregate
          (TReflectionTraverser *this,TType *baseType,TString *baseName,
          TList<glslang::TIntermBinary_*> *derefs,const_iterator deref,int offset,int blockIndex,
          int arraySize,int topLevelArraySize,int topLevelArrayStride,TStorageQualifier baseStorage,
          bool active)

{
  EShLanguageMask EVar1;
  TReflection *pTVar2;
  const_iterator cVar3;
  undefined4 pOffset;
  bool bVar4;
  uint uVar5;
  int iVar6;
  TOperator TVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  EShLanguage EVar11;
  undefined4 extraout_var;
  reference ppTVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar13;
  undefined4 extraout_var_06;
  TIntermConstantUnion *pTVar14;
  TConstUnionArray *pTVar15;
  TConstUnion *pTVar16;
  undefined4 extraout_var_07;
  TType *pTVar17;
  undefined4 extraout_var_08;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar18;
  int *piVar19;
  const_iterator deref_00;
  size_type sVar20;
  size_type sVar21;
  const_reference pvVar22;
  undefined4 extraout_var_11;
  reference pvVar23;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TArraySizes *pTVar24;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  char *pcVar25;
  mapped_type *pmVar26;
  pointer ppVar27;
  reference pvVar28;
  TList<glslang::TIntermBinary_*> *pTVar29;
  int local_774;
  int local_75c;
  bool local_719;
  EShLanguageMask *stages_1;
  int *reflectedArraySize;
  EShLanguageMask *stages;
  string local_6f8;
  TObjectReflection local_6d8;
  allocator<char> local_681;
  key_type local_680;
  mapped_type local_65c;
  iterator iStack_658;
  int uniformIndex;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_650;
  allocator<char> local_641;
  key_type local_640;
  iterator local_620;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_618;
  const_iterator it;
  TMapIndexToReflection *variables;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_600;
  _List_node_base *local_5d8;
  const_iterator local_5d0;
  const_iterator local_5c8;
  int local_5bc;
  const_iterator cStack_5b8;
  int dimSize_1;
  TType local_5b0;
  int local_518;
  int local_514;
  int dimSize;
  int arrayStride;
  TType derefType_1;
  TString newBaseName_2;
  undefined1 local_448 [4];
  int i_2;
  TVector<int> memberOffsets;
  TTypeList *typeList;
  undefined1 local_418 [8];
  TType derefType;
  pool_allocator<char> local_358;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_300;
  undefined1 local_2d8 [8];
  TString newBaseName_1;
  int i_1;
  int local_2a4;
  int local_2a0;
  int arrayIterateSize;
  int stride_2;
  int baseOffset;
  pool_allocator<char> local_270;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_218;
  pool_allocator<char> local_1f0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_1e8;
  int local_1c0;
  undefined4 local_1bc;
  int stride_1;
  _List_const_iterator<glslang::TIntermBinary_*> local_1b0;
  const_iterator nextDeref;
  pool_allocator<char> local_180;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_128;
  pool_allocator<char> local_100;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f8;
  undefined1 local_d0 [8];
  TString newBaseName;
  int local_a0;
  uint local_9c;
  int local_98;
  int i;
  int stride;
  int index;
  TIntermBinary *visitNode;
  TType *local_80;
  TType *terminalType;
  TString name;
  bool blockParent;
  bool strictArraySuffix;
  bool active_local;
  int offset_local;
  TList<glslang::TIntermBinary_*> *derefs_local;
  TString *baseName_local;
  TType *baseType_local;
  TReflectionTraverser *this_local;
  const_iterator deref_local;
  
  name.field_2._M_local_buf[0xb] = active;
  name.field_2._M_local_buf[10] =
       (this->reflection->options & EShReflectionStrictArraySuffix) != EShReflectionDefault;
  name.field_2._12_4_ = offset;
  this_local = (TReflectionTraverser *)deref._M_node;
  uVar5 = (*baseType->_vptr_TType[7])();
  pTVar29 = (TList<glslang::TIntermBinary_*> *)(ulong)uVar5;
  local_719 = false;
  if (uVar5 == 0x10) {
    iVar6 = (*baseType->_vptr_TType[0xb])();
    local_719 = ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar6) + 8) & 0x7f) == 6;
  }
  name.field_2._M_local_buf[9] = local_719;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &terminalType,baseName);
  local_80 = baseType;
  do {
    visitNode = (TIntermBinary *)
                std::__cxx11::
                list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>::
                end(&derefs->
                     super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                   );
    bVar4 = std::operator!=((_Self *)&this_local,(_Self *)&visitNode);
    if (!bVar4) {
      bVar4 = isReflectionGranularity(this,local_80);
      if (bVar4) {
        if (((this->reflection->options & EShReflectionBasicArraySuffix) != EShReflectionDefault) &&
           (uVar5 = (*local_80->_vptr_TType[0x1d])(), (uVar5 & 1) != 0)) {
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&variables);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_600,"[0]",(pool_allocator<char> *)&variables);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &terminalType,&local_600);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_600);
        }
        if (arraySize == 0) {
          arraySize = mapToGlArraySize(this,local_80);
        }
        it._M_node = (_Base_ptr)TReflection::GetVariableMapForStorage(this->reflection,baseStorage);
        pTVar2 = this->reflection;
        pcVar25 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&terminalType);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,pcVar25,&local_641);
        local_620._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&pTVar2->nameToIndex,&local_640);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::_Rb_tree_const_iterator(&local_618,&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        iStack_658 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::end(&this->reflection->nameToIndex);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::_Rb_tree_const_iterator(&local_650,&stack0xfffffffffffff9a8);
        bVar4 = std::operator==(&local_618,&local_650);
        cVar3 = it;
        if (bVar4) {
          sVar20 = std::
                   vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
                   size((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                         *)it._M_node);
          pTVar2 = this->reflection;
          local_65c = (mapped_type)sVar20;
          pcVar25 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&terminalType);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_680,pcVar25,&local_681);
          pmVar26 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&pTVar2->nameToIndex,&local_680);
          *pmVar26 = (mapped_type)sVar20;
          std::__cxx11::string::~string((string *)&local_680);
          std::allocator<char>::~allocator(&local_681);
          cVar3 = it;
          pcVar25 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&terminalType);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,pcVar25,(allocator<char> *)((long)&stages + 7));
          pOffset = name.field_2._12_4_;
          pTVar17 = local_80;
          iVar6 = mapToGlType(this,local_80);
          TObjectReflection::TObjectReflection
                    (&local_6d8,&local_6f8,pTVar17,pOffset,iVar6,arraySize,blockIndex);
          std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
          push_back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                     *)cVar3._M_node,&local_6d8);
          TObjectReflection::~TObjectReflection(&local_6d8);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&stages + 7));
          uVar5 = (*local_80->_vptr_TType[0x1d])();
          if ((uVar5 & 1) != 0) {
            iVar6 = getArrayStride(this,baseType,local_80);
            pvVar28 = std::
                      vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      ::back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                              *)it._M_node);
            pvVar28->arrayStride = iVar6;
            if (topLevelArrayStride == 0) {
              pvVar28 = std::
                        vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                        ::back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                *)it._M_node);
              topLevelArrayStride = pvVar28->arrayStride;
            }
          }
          if (((this->reflection->options & EShReflectionSeparateBuffers) != EShReflectionDefault)
             && (bVar4 = TType::isAtomic(local_80), bVar4)) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&this->reflection->atomicCounterUniformIndices,&local_65c);
          }
          iVar6 = topLevelArraySize;
          pvVar28 = std::
                    vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                    ::back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                            *)it._M_node);
          iVar10 = topLevelArrayStride;
          pvVar28->topLevelArraySize = iVar6;
          pvVar28 = std::
                    vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                    ::back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                            *)it._M_node);
          pvVar28->topLevelArrayStride = iVar10;
          if (((this->reflection->options & EShReflectionAllBlockVariables) != EShReflectionDefault)
             && ((name.field_2._M_local_buf[0xb] & 1U) != 0)) {
            pvVar28 = std::
                      vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      ::back((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                              *)it._M_node);
            EVar1 = pvVar28->stages;
            EVar11 = TIntermediate::getStage(this->intermediate);
            pvVar28->stages = EVar1 | 1 << ((byte)EVar11 & 0x1f);
          }
        }
        else {
          if (1 < arraySize) {
            ppVar27 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      ::operator->(&local_618);
            pvVar28 = std::
                      vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      ::operator[]((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    *)cVar3._M_node,(long)ppVar27->second);
            piVar19 = std::max<int>(&arraySize,&pvVar28->size);
            pvVar28->size = *piVar19;
          }
          cVar3._M_node = it._M_node;
          if (((this->reflection->options & EShReflectionAllBlockVariables) != EShReflectionDefault)
             && ((name.field_2._M_local_buf[0xb] & 1U) != 0)) {
            ppVar27 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      ::operator->(&local_618);
            pvVar28 = std::
                      vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      ::operator[]((vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    *)cVar3._M_node,(long)ppVar27->second);
            EVar1 = pvVar28->stages;
            EVar11 = TIntermediate::getStage(this->intermediate);
            pvVar28->stages = EVar1 | 1 << ((byte)EVar11 & 0x1f);
          }
        }
        local_1bc = 0;
      }
      else {
        arrayIterateSize = name.field_2._12_4_;
        uVar5 = (*local_80->_vptr_TType[0x1d])();
        if ((uVar5 & 1) == 0) {
          memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)TType::getStruct(local_80);
          TVector<int>::TVector((TVector<int> *)local_448);
          if (-1 < arrayIterateSize) {
            sVar20 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     size((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            std::vector<int,_glslang::pool_allocator<int>_>::resize
                      ((vector<int,_glslang::pool_allocator<int>_> *)local_448,sVar20);
            getOffsets(this,local_80,(TVector<int> *)local_448);
          }
          for (newBaseName_2.field_2._12_4_ = 0;
              sVar20 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                       size((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             *)memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                               super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage),
              (int)newBaseName_2.field_2._12_4_ < (int)sVar20;
              newBaseName_2.field_2._12_4_ = newBaseName_2.field_2._12_4_ + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&derefType_1.spirvType,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&terminalType);
            sVar21 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     size((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&derefType_1.spirvType);
            if (sVar21 != 0) {
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&derefType_1.spirvType,".");
            }
            pvVar22 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                      operator[]((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  *)memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                                    super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                                 (long)(int)newBaseName_2.field_2._12_4_);
            iVar6 = (*pvVar22->type->_vptr_TType[6])();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &derefType_1.spirvType,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     CONCAT44(extraout_var_11,iVar6));
            TType::TType((TType *)&dimSize,local_80,newBaseName_2.field_2._12_4_,false);
            iVar6 = arrayIterateSize;
            if (-1 < (int)name.field_2._12_4_) {
              pvVar23 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                                  ((vector<int,_glslang::pool_allocator<int>_> *)local_448,
                                   (long)(int)newBaseName_2.field_2._12_4_);
              name.field_2._12_4_ = iVar6 + *pvVar23;
            }
            local_514 = topLevelArrayStride;
            iVar6 = (*local_80->_vptr_TType[7])();
            if (((iVar6 == 0x10) &&
                (iVar6 = (*local_80->_vptr_TType[0xb])(),
                ((uint)*(undefined8 *)(CONCAT44(extraout_var_12,iVar6) + 8) & 0x7f) == 6)) &&
               (bVar4 = TType::isArray((TType *)&dimSize), bVar4)) {
              local_514 = getArrayStride(this,baseType,(TType *)&dimSize);
            }
            if (((topLevelArraySize == -1) && (local_514 == 0)) &&
               ((name.field_2._M_local_buf[9] & 1U) != 0)) {
              topLevelArraySize = 1;
            }
            if (((name.field_2._M_local_buf[10] & 1U) == 0) ||
               ((name.field_2._M_local_buf[9] & 1U) == 0)) {
              local_5d8 = (_List_node_base *)
                          std::__cxx11::
                          list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                          ::end(&derefs->
                                 super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                               );
              blowUpActiveAggregate
                        (this,(TType *)&dimSize,(TString *)&derefType_1.spirvType,derefs,
                         (const_iterator)local_5d8,name.field_2._12_4_,blockIndex,0,
                         topLevelArraySize,local_514,baseStorage,
                         (bool)(name.field_2._M_local_buf[0xb] & 1));
            }
            else {
              bVar4 = TType::isArray((TType *)&dimSize);
              if ((bVar4) && (bVar4 = TType::isStruct((TType *)&dimSize), bVar4)) {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&derefType_1.spirvType,"[0]");
                bVar4 = TType::isUnsizedArray((TType *)&dimSize);
                if (bVar4) {
                  local_75c = 0;
                }
                else {
                  pTVar24 = TType::getArraySizes((TType *)&dimSize);
                  local_75c = TArraySizes::getDimSize(pTVar24,0);
                }
                local_518 = local_75c;
                TType::TType(&local_5b0,(TType *)&dimSize,0,false);
                cStack_5b8 = std::__cxx11::
                             list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                             ::end(&derefs->
                                    super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                  );
                pvVar23 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                                    ((vector<int,_glslang::pool_allocator<int>_> *)local_448,
                                     (long)(int)newBaseName_2.field_2._12_4_);
                iVar9 = local_514;
                iVar10 = local_518;
                iVar6 = *pvVar23;
                iVar8 = (*local_80->_vptr_TType[0xb])();
                blowUpActiveAggregate
                          (this,&local_5b0,(TString *)&derefType_1.spirvType,derefs,cStack_5b8,iVar6
                           ,blockIndex,0,iVar10,iVar9,
                           (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_13,iVar8) + 8) &
                           0x7f,false);
                TType::~TType(&local_5b0);
              }
              else {
                bVar4 = TType::isArray((TType *)&dimSize);
                if (bVar4) {
                  bVar4 = TType::isUnsizedArray((TType *)&dimSize);
                  if (bVar4) {
                    local_774 = 0;
                  }
                  else {
                    pTVar24 = TType::getArraySizes((TType *)&dimSize);
                    local_774 = TArraySizes::getDimSize(pTVar24,0);
                  }
                  local_5bc = local_774;
                  local_5c8 = std::__cxx11::
                              list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                              ::end(&derefs->
                                     super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                   );
                  pvVar23 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                                      ((vector<int,_glslang::pool_allocator<int>_> *)local_448,
                                       (long)(int)newBaseName_2.field_2._12_4_);
                  iVar10 = local_5bc;
                  iVar6 = *pvVar23;
                  iVar9 = (*local_80->_vptr_TType[0xb])();
                  blowUpActiveAggregate
                            (this,(TType *)&dimSize,(TString *)&derefType_1.spirvType,derefs,
                             local_5c8,iVar6,blockIndex,0,iVar10,0,
                             (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_14,iVar9) + 8)
                             & 0x7f,false);
                }
                else {
                  local_5d0 = std::__cxx11::
                              list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                              ::end(&derefs->
                                     super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                   );
                  pvVar23 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                                      ((vector<int,_glslang::pool_allocator<int>_> *)local_448,
                                       (long)(int)newBaseName_2.field_2._12_4_);
                  iVar6 = *pvVar23;
                  iVar10 = (*local_80->_vptr_TType[0xb])();
                  blowUpActiveAggregate
                            (this,(TType *)&dimSize,(TString *)&derefType_1.spirvType,derefs,
                             local_5d0,iVar6,blockIndex,0,1,0,
                             (TStorageQualifier)
                             *(undefined8 *)(CONCAT44(extraout_var_15,iVar10) + 8) & 0x7f,false);
                }
              }
            }
            TType::~TType((TType *)&dimSize);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&derefType_1.spirvType);
          }
          TVector<int>::~TVector((TVector<int> *)local_448);
        }
        else {
          local_2a0 = 0;
          if (-1 < (int)name.field_2._12_4_) {
            local_2a0 = getArrayStride(this,baseType,local_80);
          }
          i_1 = (*local_80->_vptr_TType[0xf])();
          newBaseName_1.field_2._12_4_ = 1;
          piVar19 = std::max<int>(&i_1,(int *)(newBaseName_1.field_2._M_local_buf + 0xc));
          local_2a4 = *piVar19;
          if ((((name.field_2._M_local_buf[10] & 1U) != 0) &&
              ((name.field_2._M_local_buf[9] & 1U) != 0)) ||
             ((topLevelArraySize == local_2a4 && (topLevelArrayStride == 0)))) {
            local_2a4 = 1;
          }
          if (topLevelArrayStride == 0) {
            topLevelArrayStride = local_2a0;
          }
          for (newBaseName_1.field_2._8_4_ = 0; iVar6 = (int)pTVar29,
              (int)newBaseName_1.field_2._8_4_ < local_2a4;
              newBaseName_1.field_2._8_4_ = newBaseName_1.field_2._8_4_ + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)local_2d8,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&terminalType);
            iVar10 = (*local_80->_vptr_TType[7])();
            if (iVar10 != 0x10) {
              pool_allocator<char>::pool_allocator(&local_358);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_350,"[",&local_358);
              String_abi_cxx11_((TString *)&derefType.spirvType,
                                (glslang *)(ulong)(uint)newBaseName_1.field_2._8_4_,10,iVar6);
              std::operator+(&local_328,&local_350,
                             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&derefType.spirvType);
              std::operator+(&local_300,&local_328,"]");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_2d8,&local_300);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_300);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_328);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&derefType.spirvType);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_350);
            }
            TType::TType((TType *)local_418,local_80,0,false);
            if (-1 < (int)name.field_2._12_4_) {
              name.field_2._12_4_ = arrayIterateSize + local_2a0 * newBaseName_1.field_2._8_4_;
            }
            deref_00 = std::__cxx11::
                       list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                       ::end(&derefs->
                              super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                            );
            pTVar29 = derefs;
            blowUpActiveAggregate
                      (this,(TType *)local_418,(TString *)local_2d8,derefs,deref_00,
                       name.field_2._12_4_,blockIndex,0,topLevelArraySize,topLevelArrayStride,
                       baseStorage,(bool)(name.field_2._M_local_buf[0xb] & 1));
            TType::~TType((TType *)local_418);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_2d8);
          }
        }
        local_1bc = 1;
      }
LAB_0054b018:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &terminalType);
      return;
    }
    ppTVar12 = std::_List_const_iterator<glslang::TIntermBinary_*>::operator*
                         ((_List_const_iterator<glslang::TIntermBinary_*> *)&this_local);
    _stride = *ppTVar12;
    iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1e])();
    local_80 = (TType *)CONCAT44(extraout_var_00,iVar6);
    TVar7 = TIntermOperator::getOp(&_stride->super_TIntermOperator);
    pTVar29 = (TList<glslang::TIntermBinary_*> *)(ulong)TVar7;
    if (TVar7 == EOpIndexDirect) {
      iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0xf0))();
      local_1c0 = getArrayStride(this,baseType,pTVar17);
      iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      pTVar14 = (TIntermConstantUnion *)
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x28))();
      pTVar15 = TIntermConstantUnion::getConstArray(pTVar14);
      pTVar16 = TConstUnionArray::operator[](pTVar15,0);
      i = TConstUnion::getIConst(pTVar16);
      iVar6 = (*local_80->_vptr_TType[7])();
      if (iVar6 != 0x10) {
        if (((name.field_2._M_local_buf[10] & 1U) == 0) ||
           ((name.field_2._M_local_buf[9] & 1U) == 0)) {
          if (((name.field_2._M_local_buf[10] & 1U) != 0) ||
             (iVar6 = (*baseType->_vptr_TType[7])(), iVar6 != 0x10)) {
            pool_allocator<char>::pool_allocator(&local_270);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_268,"[",&local_270);
            String_abi_cxx11_((TString *)&stride_2,(glslang *)(ulong)(uint)i,10,(int)pTVar29);
            std::operator+(&local_240,&local_268,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&stride_2);
            std::operator+(&local_218,&local_240,"]");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &terminalType,&local_218);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_218);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_240);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&stride_2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_268);
            if (-1 < (int)name.field_2._12_4_) {
              name.field_2._12_4_ = local_1c0 * i + name.field_2._12_4_;
            }
          }
        }
        else {
          pool_allocator<char>::pool_allocator(&local_1f0);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_1e8,"[0]",&local_1f0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &terminalType,&local_1e8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_1e8);
        }
      }
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = local_1c0;
      }
      if (topLevelArrayStride != 0) {
        iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0xf0))();
        uVar13 = (**(code **)(*plVar18 + 0xe8))();
        if ((uVar13 & 1) != 0) {
          name.field_2._M_local_buf[9] = '\0';
        }
      }
    }
    else {
      if (TVar7 == EOpIndexIndirect) {
        iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0xf0))();
        local_98 = getArrayStride(this,baseType,pTVar17);
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = local_98;
        }
        local_9c = 0;
        while( true ) {
          uVar5 = local_9c;
          iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0xf0))();
          local_a0 = (**(code **)(*plVar18 + 0x78))();
          newBaseName.field_2._12_4_ = 1;
          piVar19 = std::max<int>(&local_a0,(int *)(newBaseName.field_2._M_local_buf + 0xc));
          if (*piVar19 <= (int)uVar5) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )local_d0,
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )&terminalType);
          iVar10 = (int)piVar19;
          iVar6 = (*local_80->_vptr_TType[7])();
          if (iVar6 != 0x10) {
            if (((name.field_2._M_local_buf[10] & 1U) == 0) ||
               ((name.field_2._M_local_buf[9] & 1U) == 0)) {
              if (((name.field_2._M_local_buf[10] & 1U) != 0) ||
                 (iVar6 = (*baseType->_vptr_TType[7])(), iVar6 != 0x10)) {
                pool_allocator<char>::pool_allocator(&local_180);
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)&local_178,"[",&local_180);
                String_abi_cxx11_((TString *)&nextDeref,(glslang *)(ulong)local_9c,10,iVar10);
                std::operator+(&local_150,&local_178,
                               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)&nextDeref);
                std::operator+(&local_128,&local_150,"]");
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)local_d0,&local_128);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string(&local_128);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string(&local_150);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&nextDeref);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string(&local_178);
              }
            }
            else {
              pool_allocator<char>::pool_allocator(&local_100);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_f8,"[0]",&local_100);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_d0,&local_f8);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_f8);
            }
          }
          local_1b0._M_node = (_List_node_base *)this_local;
          std::_List_const_iterator<glslang::TIntermBinary_*>::operator++(&local_1b0);
          _stride_1 = local_1b0._M_node;
          blowUpActiveAggregate
                    (this,local_80,(TString *)local_d0,derefs,(const_iterator)local_1b0._M_node,
                     name.field_2._12_4_,blockIndex,arraySize,topLevelArraySize,topLevelArrayStride,
                     baseStorage,(bool)(name.field_2._M_local_buf[0xb] & 1));
          if (-1 < (int)name.field_2._12_4_) {
            name.field_2._12_4_ = local_98 + name.field_2._12_4_;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_d0);
          local_9c = local_9c + 1;
        }
        local_1bc = 1;
        goto LAB_0054b018;
      }
      if (TVar7 == EOpIndexDirectStruct) {
        iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])();
        pTVar14 = (TIntermConstantUnion *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x28))();
        pTVar15 = TIntermConstantUnion::getConstArray(pTVar14);
        pTVar16 = TConstUnionArray::operator[](pTVar15,0);
        i = TConstUnion::getIConst(pTVar16);
        if (-1 < (int)name.field_2._12_4_) {
          iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0xf0))();
          iVar6 = TIntermediate::getOffset(pTVar17,i);
          name.field_2._12_4_ = iVar6 + name.field_2._12_4_;
        }
        sVar21 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&terminalType);
        if (sVar21 != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &terminalType,".");
        }
        iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0xf0))();
        this_00 = &TType::getStruct(pTVar17)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        pvVar22 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                  operator[](this_00,(long)i);
        iVar6 = (*pvVar22->type->_vptr_TType[6])();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &terminalType,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_09,iVar6));
        iVar6 = (*(_stride->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0xf0))();
        iVar6 = (**(code **)(*plVar18 + 0x38))();
        if ((iVar6 != 0x10) && (uVar5 = (*local_80->_vptr_TType[0x1d])(), (uVar5 & 1) != 0)) {
          name.field_2._M_local_buf[9] = '\0';
        }
      }
    }
    std::_List_const_iterator<glslang::TIntermBinary_*>::operator++
              ((_List_const_iterator<glslang::TIntermBinary_*> *)&this_local);
  } while( true );
}

Assistant:

void blowUpActiveAggregate(const TType& baseType, const TString& baseName, const TList<TIntermBinary*>& derefs,
                               TList<TIntermBinary*>::const_iterator deref, int offset, int blockIndex, int arraySize,
                               int topLevelArraySize, int topLevelArrayStride, TStorageQualifier baseStorage, bool active)
    {
        // when strictArraySuffix is enabled, we closely follow the rules from ARB_program_interface_query.
        // Broadly:
        // * arrays-of-structs always have a [x] suffix.
        // * with array-of-struct variables in the root of a buffer block, only ever return [0].
        // * otherwise, array suffixes are added whenever we iterate, even if that means expanding out an array.
        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        // is this variable inside a buffer block. This flag is set back to false after we iterate inside the first array element.
        bool blockParent = (baseType.getBasicType() == EbtBlock && baseType.getQualifier().storage == EvqBuffer);

        // process the part of the dereference chain that was explicit in the shader
        TString name = baseName;
        const TType* terminalType = &baseType;
        for (; deref != derefs.end(); ++deref) {
            TIntermBinary* visitNode = *deref;
            terminalType = &visitNode->getType();
            int index;
            switch (visitNode->getOp()) {
            case EOpIndexIndirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // Visit all the indices of this array, and for each one add on the remaining dereferencing
                for (int i = 0; i < std::max(visitNode->getLeft()->getType().getOuterArraySize(), 1); ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() == EbtBlock) {}
                    else if (strictArraySuffix && blockParent)
                        newBaseName.append(TString("[0]"));
                    else if (strictArraySuffix || baseType.getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TList<TIntermBinary*>::const_iterator nextDeref = deref;
                    ++nextDeref;
                    blowUpActiveAggregate(*terminalType, newBaseName, derefs, nextDeref, offset, blockIndex, arraySize,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);

                    if (offset >= 0)
                        offset += stride;
                }

                // it was all completed in the recursive calls above
                return;
            }
            case EOpIndexDirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (terminalType->getBasicType() == EbtBlock) {}
                else if (strictArraySuffix && blockParent)
                    name.append(TString("[0]"));
                else if (strictArraySuffix || baseType.getBasicType() != EbtBlock) {
                    name.append(TString("[") + String(index) + "]");

                    if (offset >= 0)
                        offset += stride * index;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // expand top-level arrays in blocks with [0] suffix
                if (topLevelArrayStride != 0 && visitNode->getLeft()->getType().isArray()) {
                    blockParent = false;
                }
                break;
            }
            case EOpIndexDirectStruct:
                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (offset >= 0)
                    offset += intermediate.getOffset(visitNode->getLeft()->getType(), index);
                if (name.size() > 0)
                    name.append(".");
                name.append((*visitNode->getLeft()->getType().getStruct())[index].type->getFieldName());

                // expand non top-level arrays with [x] suffix
                if (visitNode->getLeft()->getType().getBasicType() != EbtBlock && terminalType->isArray())
                {
                    blockParent = false;
                }
                break;
            default:
                break;
            }
        }

        // if the terminalType is still too coarse a granularity, this is still an aggregate to expand, expand it...
        if (! isReflectionGranularity(*terminalType)) {
            // the base offset of this node, that children are relative to
            int baseOffset = offset;

            if (terminalType->isArray()) {
                // Visit all the indices of this array, and for each one,
                // fully explode the remaining aggregate to dereference

                int stride = 0;
                if (offset >= 0)
                    stride = getArrayStride(baseType, *terminalType);

                int arrayIterateSize = std::max(terminalType->getOuterArraySize(), 1);

                // for top-level arrays in blocks, only expand [0] to avoid explosion of items
                if ((strictArraySuffix && blockParent) ||
                    ((topLevelArraySize == arrayIterateSize) && (topLevelArrayStride == 0))) {
                    arrayIterateSize = 1;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                for (int i = 0; i < arrayIterateSize; ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TType derefType(*terminalType, 0);
                    if (offset >= 0)
                        offset = baseOffset + stride * i;

                    blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);
                }
            } else {
                // Visit all members of this aggregate, and for each one,
                // fully explode the remaining aggregate to dereference
                const TTypeList& typeList = *terminalType->getStruct();

                TVector<int> memberOffsets;

                if (baseOffset >= 0) {
                    memberOffsets.resize(typeList.size());
                    getOffsets(*terminalType, memberOffsets);
                }

                for (int i = 0; i < (int)typeList.size(); ++i) {
                    TString newBaseName = name;
                    if (newBaseName.size() > 0)
                        newBaseName.append(".");
                    newBaseName.append(typeList[i].type->getFieldName());
                    TType derefType(*terminalType, i);
                    if (offset >= 0)
                        offset = baseOffset + memberOffsets[i];

                    int arrayStride = topLevelArrayStride;
                    if (terminalType->getBasicType() == EbtBlock && terminalType->getQualifier().storage == EvqBuffer &&
                        derefType.isArray()) {
                        arrayStride = getArrayStride(baseType, derefType);
                    }

                    if (topLevelArraySize == -1 && arrayStride == 0 && blockParent)
                        topLevelArraySize = 1;

                    if (strictArraySuffix && blockParent) {
                        // if this member is an array, store the top-level array stride but start the explosion from
                        // the inner struct type.
                        if (derefType.isArray() && derefType.isStruct()) {
                            newBaseName.append("[0]");
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(TType(derefType, 0), newBaseName, derefs, derefs.end(), memberOffsets[i],
                                blockIndex, 0, dimSize, arrayStride, terminalType->getQualifier().storage, false);
                        }
                        else if (derefType.isArray()) {
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, dimSize, 0, terminalType->getQualifier().storage, false);
                        }
                        else {
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, 1, 0, terminalType->getQualifier().storage, false);
                        }
                    } else {
                        blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                              topLevelArraySize, arrayStride, baseStorage, active);
                    }
                }
            }

            // it was all completed in the recursive calls above
            return;
        }

        if ((reflection.options & EShReflectionBasicArraySuffix) && terminalType->isArray()) {
            name.append(TString("[0]"));
        }

        // Finally, add a full string to the reflection database, and update the array size if necessary.
        // If the dereferenced entity to record is an array, compute the size and update the maximum size.

        // there might not be a final array dereference, it could have been copied as an array object
        if (arraySize == 0)
            arraySize = mapToGlArraySize(*terminalType);

        TReflection::TMapIndexToReflection& variables = reflection.GetVariableMapForStorage(baseStorage);

        TReflection::TNameToIndex::const_iterator it = reflection.nameToIndex.find(name.c_str());
        if (it == reflection.nameToIndex.end()) {
            int uniformIndex = (int)variables.size();
            reflection.nameToIndex[name.c_str()] = uniformIndex;
            variables.push_back(TObjectReflection(name.c_str(), *terminalType, offset, mapToGlType(*terminalType),
                                                  arraySize, blockIndex));
            if (terminalType->isArray()) {
                variables.back().arrayStride = getArrayStride(baseType, *terminalType);
                if (topLevelArrayStride == 0)
                    topLevelArrayStride = variables.back().arrayStride;
            }

            if ((reflection.options & EShReflectionSeparateBuffers) && terminalType->isAtomic())
                reflection.atomicCounterUniformIndices.push_back(uniformIndex);

            variables.back().topLevelArraySize = topLevelArraySize;
            variables.back().topLevelArrayStride = topLevelArrayStride;
            
            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
                EShLanguageMask& stages = variables.back().stages;
                stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        } else {
            if (arraySize > 1) {
                int& reflectedArraySize = variables[it->second].size;
                reflectedArraySize = std::max(arraySize, reflectedArraySize);
            }

            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
              EShLanguageMask& stages = variables[it->second].stages;
              stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        }
    }